

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::ImportScriptPubKeys
          (CWallet *this,string *label,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool have_solving_data,bool apply_label,int64_t timestamp)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  bool bVar3;
  LegacyScriptPubKeyMan *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  CTxDestination dest;
  WalletBatch local_b0;
  _Storage<wallet::AddressPurpose,_true> local_a0;
  undefined1 local_9c;
  unique_lock<std::recursive_mutex> local_98;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    bVar2 = false;
  }
  else {
    local_98._M_device =
         &(this_00->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
          super_recursive_mutex;
    local_98._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_98);
    bVar2 = LegacyScriptPubKeyMan::ImportScriptPubKeys
                      (this_00,script_pub_keys,have_solving_data,timestamp);
    if (apply_label && bVar2) {
      pWVar1 = (this->m_database)._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      if (pWVar1 == (WalletDatabase *)0x0) {
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      (*pWVar1->_vptr_WalletDatabase[0xe])(&local_b0,pWVar1,1);
      p_Var4 = (script_pub_keys->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(script_pub_keys->_M_t)._M_impl.super__Rb_tree_header;
      local_b0.m_database = pWVar1;
      if ((_Rb_tree_header *)p_Var4 != p_Var5) {
        do {
          local_88._16_8_ = 0;
          local_88._24_8_ = 0;
          local_88._0_8_ = 0;
          local_88._8_8_ = 0;
          local_40 = 0;
          ExtractDestination((CScript *)(p_Var4 + 1),(CTxDestination *)&local_88._M_first);
          bVar3 = IsValidDestination((CTxDestination *)&local_88._M_first);
          if (bVar3) {
            local_a0._M_value = RECEIVE;
            local_9c = 1;
            SetAddressBookWithDB
                      (this,&local_b0,(CTxDestination *)&local_88._M_first,label,
                       (optional<wallet::AddressPurpose> *)&local_a0);
          }
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_88._M_first);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var5);
      }
      if (local_b0.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_b0.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CWallet::ImportScriptPubKeys(const std::string& label, const std::set<CScript>& script_pub_keys, const bool have_solving_data, const bool apply_label, const int64_t timestamp)
{
    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return false;
    }
    LOCK(spk_man->cs_KeyStore);
    if (!spk_man->ImportScriptPubKeys(script_pub_keys, have_solving_data, timestamp)) {
        return false;
    }
    if (apply_label) {
        WalletBatch batch(GetDatabase());
        for (const CScript& script : script_pub_keys) {
            CTxDestination dest;
            ExtractDestination(script, dest);
            if (IsValidDestination(dest)) {
                SetAddressBookWithDB(batch, dest, label, AddressPurpose::RECEIVE);
            }
        }
    }
    return true;
}